

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O2

void map_dungeon(dungeon_map *map,uint8_t x,uint8_t y,BOOL have_keys)

{
  byte bVar1;
  byte bVar2;
  dw_warp *pdVar3;
  dw_warp *pdVar4;
  dungeon_map *pdVar5;
  ulong uVar6;
  uint8_t *puVar7;
  long lVar8;
  undefined7 in_register_00000031;
  
  if (map != (dungeon_map *)0x0) {
    uVar6 = CONCAT71(in_register_00000031,x) & 0xffffffff;
    for (; (x < map->width && (y < map->height)); y = y + 1) {
      bVar1 = map->tiles[uVar6][y];
      if ((bVar1 & 8) != 0) {
        return;
      }
      puVar7 = map->tiles[uVar6] + y;
      if (bVar1 == 5) {
        if (have_keys == FALSE) {
          return;
        }
        *puVar7 = 0xd;
      }
      else {
        if (bVar1 == 0) {
          return;
        }
        if (bVar1 == 6) {
          return;
        }
        *puVar7 = bVar1 | 8;
        pdVar4 = warps_to;
        pdVar3 = warps_from;
        if ((bVar1 | 10) == 0xb) {
          for (lVar8 = 2; bVar1 = *(byte *)((long)warps_to + lVar8 + -2), bVar1 != 0;
              lVar8 = lVar8 + 3) {
            bVar2 = *(byte *)((long)warps_from + lVar8 + -2);
            if (((bVar2 == map->index) && (*(uint8_t *)((long)warps_from + lVar8 + -1) == x)) &&
               ((&warps_from->map)[lVar8] == y)) {
              pdVar5 = get_map((uint)bVar1);
              map_dungeon(pdVar5,*(uint8_t *)((long)pdVar4 + lVar8 + -1),(&pdVar4->map)[lVar8],
                          have_keys);
              break;
            }
            if (((bVar1 == map->index) && (*(uint8_t *)((long)warps_to + lVar8 + -1) == x)) &&
               ((&warps_to->map)[lVar8] == y)) {
              pdVar5 = get_map((uint)bVar2);
              map_dungeon(pdVar5,*(uint8_t *)((long)pdVar3 + lVar8 + -1),(&pdVar3->map)[lVar8],
                          have_keys);
              break;
            }
          }
        }
      }
      map_dungeon(map,x + 0xff,y,have_keys);
      map_dungeon(map,x + '\x01',y,have_keys);
      map_dungeon(map,x,y - 1,have_keys);
    }
  }
  return;
}

Assistant:

static void map_dungeon(dungeon_map *map, uint8_t x, uint8_t y, BOOL have_keys)
{
    dw_warp warp;

    if (!map)
        return;

    if (map_ob(map, x, y))
        return;

    if (map->tiles[x][y] & 0x8)
        return;

    if (!tile_is_walkable(map->tiles[x][y], have_keys))
        return;

    map->tiles[x][y] |= 0x8;
    if (map->tiles[x][y] == (DUNGEON_TILE_STAIRS_UP | 0x8) ||
        map->tiles[x][y] == (DUNGEON_TILE_STAIRS_DOWN | 0x8)) {
        follow_warp(map, x, y, have_keys);
    }
    map_dungeon(map, x-1, y, have_keys);
    map_dungeon(map, x+1, y, have_keys);
    map_dungeon(map, x, y-1, have_keys);
    map_dungeon(map, x, y+1, have_keys);


}